

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlGetMaxOccurs(xmlSchemaParserCtxtPtr ctxt,xmlNodePtr node,int min,int max,int def,
                   char *expected)

{
  int iVar1;
  xmlNodePtr node_00;
  byte *str1;
  byte *pbVar2;
  ulong uVar3;
  xmlChar *unaff_RBX;
  byte bVar4;
  int iVar5;
  undefined4 in_register_00000084;
  undefined4 in_stack_ffffffffffffffc8;
  
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode(node,"maxOccurs");
  if ((node_00 != (xmlNodePtr)0x0) &&
     (str1 = xmlSchemaGetNodeContent(ctxt,node_00), str1 != (byte *)0x0)) {
    iVar1 = xmlStrEqual(str1,"unbounded");
    pbVar2 = str1;
    if (iVar1 == 0) {
      for (; uVar3 = (ulong)*pbVar2, uVar3 < 0x21; pbVar2 = pbVar2 + 1) {
        if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
          if (uVar3 == 0) goto LAB_0019c48f;
          break;
        }
      }
      bVar4 = *pbVar2;
      iVar1 = 0;
      if ((byte)(bVar4 - 0x30) < 10) {
        iVar5 = 0;
        do {
          iVar1 = 0x7fffffff;
          if ((iVar5 < 0xccccccd) &&
             (iVar1 = (bVar4 - 0x30) + iVar5 * 10, (int)(-0x7fffffd1 - (uint)bVar4) < iVar5 * 10)) {
            iVar1 = 0x7fffffff;
          }
          bVar4 = pbVar2[1];
          pbVar2 = pbVar2 + 1;
          iVar5 = iVar1;
        } while ((byte)(bVar4 - 0x30) < 10);
      }
      for (; uVar3 = (ulong)*pbVar2, uVar3 < 0x21; pbVar2 = pbVar2 + 1) {
        if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
          if ((uVar3 == 0) && (min <= iVar1 && iVar1 <= max)) {
            return iVar1;
          }
          break;
        }
      }
    }
    else if (max == 0x40000000) {
      return 0x40000000;
    }
LAB_0019c48f:
    xmlSchemaPSimpleTypeErr
              (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)node_00,
               (xmlNodePtr)0x0,(xmlSchemaTypePtr)CONCAT44(in_register_00000084,def),(char *)str1,
               (xmlChar *)0x0,(char *)0x0,(xmlChar *)CONCAT44(min,in_stack_ffffffffffffffc8),
               unaff_RBX);
  }
  return 1;
}

Assistant:

static int
xmlGetMaxOccurs(xmlSchemaParserCtxtPtr ctxt, xmlNodePtr node,
		int min, int max, int def, const char *expected)
{
    const xmlChar *val, *cur;
    int ret = 0;
    xmlAttrPtr attr;

    attr = xmlSchemaGetPropNode(node, "maxOccurs");
    if (attr == NULL)
	return (def);
    val = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if (val == NULL)
        return (def);

    if (xmlStrEqual(val, (const xmlChar *) "unbounded")) {
	if (max != UNBOUNDED) {
	    xmlSchemaPSimpleTypeErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		/* XML_SCHEMAP_INVALID_MINOCCURS, */
		NULL, (xmlNodePtr) attr, NULL, expected,
		val, NULL, NULL, NULL);
	    return (def);
	} else
	    return (UNBOUNDED);  /* encoding it with -1 might be another option */
    }

    cur = val;
    while (IS_BLANK_CH(*cur))
        cur++;
    if (*cur == 0) {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
	return (def);
    }
    while ((*cur >= '0') && (*cur <= '9')) {
        if (ret > INT_MAX / 10) {
            ret = INT_MAX;
        } else {
            int digit = *cur - '0';
            ret *= 10;
            if (ret > INT_MAX - digit)
                ret = INT_MAX;
            else
                ret += digit;
        }
        cur++;
    }
    while (IS_BLANK_CH(*cur))
        cur++;
    /*
    * TODO: Restrict the maximal value to Integer.
    */
    if ((*cur != 0) || (ret < min) || ((max != -1) && (ret > max))) {
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    /* XML_SCHEMAP_INVALID_MINOCCURS, */
	    NULL, (xmlNodePtr) attr, NULL, expected,
	    val, NULL, NULL, NULL);
        return (def);
    }
    return (ret);
}